

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::instructionDispatchLoop(SelectionEvaluator *this,SelectionSet *bs)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  fd_set *__writefds;
  fd_set *__readfds;
  int in_ESI;
  SelectionEvaluator *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  Token *in_stack_00000008;
  SelectionEvaluator *in_stack_00000010;
  Token token;
  Token *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_28;
  
  do {
    uVar1 = in_RDI->pc;
    sVar3 = std::
            vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            ::size(&in_RDI->aatoken);
    if (sVar3 <= uVar1) {
      return;
    }
    uVar1 = in_RDI->pc;
    in_RDI->pc = uVar1 + 1;
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::operator[](&in_RDI->aatoken,(ulong)uVar1);
    this_00 = (Token *)&in_RDI->statement;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
              ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)this,
               (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)bs);
    __writefds = (fd_set *)
                 std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size
                           ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)this_00);
    in_RDI->statementLength = (int)__writefds;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
              ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)this_00,0);
    Token::Token((Token *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),this_00);
    in_stack_ffffffffffffffb4 = local_28;
    if (local_28 == 0x301) {
      define(this);
LAB_003bea08:
      bVar2 = false;
    }
    else {
      if (local_28 == 0x302) {
        select(in_RDI,in_ESI,__readfds,__writefds,in_R8,in_R9);
        goto LAB_003bea08;
      }
      unrecognizedCommand(in_stack_00000010,in_stack_00000008);
      bVar2 = true;
    }
    Token::~Token((Token *)0x3bea1a);
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void SelectionEvaluator::instructionDispatchLoop(SelectionSet& bs) {
    while (pc < aatoken.size()) {
      statement       = aatoken[pc++];
      statementLength = statement.size();
      Token token     = statement[0];
      switch (token.tok) {
      case Token::define:
        define();
        break;
      case Token::select:
        select(bs);
        break;
      default:
        unrecognizedCommand(token);
        return;
      }
    }
  }